

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

ProdItem *
slang::ast::RandSeqProductionSymbol::createProdItem
          (ProdItem *__return_storage_ptr__,RsProdItemSyntax *syntax,ASTContext *context)

{
  ArgumentListSyntax *argSyntax;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> formalArgs;
  int iVar1;
  RandSeqProductionSymbol *pRVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  string_view sVar3;
  SourceRange SVar4;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  
  sVar3 = parsing::Token::valueText(&syntax->name);
  SVar4 = parsing::Token::range(&syntax->name);
  pRVar2 = findProduction(sVar3,SVar4,context);
  if (pRVar2 == (RandSeqProductionSymbol *)0x0) {
    (__return_storage_ptr__->super_ProdBase).kind = Item;
    __return_storage_ptr__->target = (RandSeqProductionSymbol *)0x0;
    (__return_storage_ptr__->args)._M_ptr = (pointer)0x0;
    (__return_storage_ptr__->args)._M_extent._M_extent_value = 0;
  }
  else {
    local_70[0].data_ = (pointer)local_70[0].firstElement;
    local_70[0].len = 0;
    local_70[0].cap = 5;
    argSyntax = syntax->argList;
    formalArgs = pRVar2->arguments;
    sVar3 = (pRVar2->super_Symbol).name;
    SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    CallExpression::bindArgs(argSyntax,formalArgs,sVar3,SVar4,context,local_70,false);
    iVar1 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_70,(EVP_PKEY_CTX *)((context->scope).ptr)->compilation,src);
    (__return_storage_ptr__->super_ProdBase).kind = Item;
    __return_storage_ptr__->target = pRVar2;
    (__return_storage_ptr__->args)._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
    (__return_storage_ptr__->args)._M_extent._M_extent_value = extraout_RDX;
    if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
      operator_delete(local_70[0].data_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RandSeqProductionSymbol::ProdItem RandSeqProductionSymbol::createProdItem(
    const RsProdItemSyntax& syntax, const ASTContext& context) {

    auto symbol = findProduction(syntax.name.valueText(), syntax.name.range(), context);
    if (!symbol)
        return ProdItem(nullptr, {});

    SmallVector<const Expression*> args;
    CallExpression::bindArgs(syntax.argList, symbol->arguments, symbol->name, syntax.sourceRange(),
                             context, args, /* isBuiltInMethod */ false);

    return ProdItem(symbol, args.copy(context.getCompilation()));
}